

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_tools.cxx
# Opt level: O1

void __thiscall
object_tools::save_skl(object_tools *this,xr_object *object,char *source,cl_parser *cl)

{
  pointer ppxVar1;
  xr_skl_motion *this_00;
  pointer pcVar2;
  size_type sVar3;
  bool bVar4;
  bool bVar5;
  long *plVar6;
  undefined8 uVar7;
  long *plVar8;
  pointer ppxVar9;
  string target;
  string name;
  string motion_name;
  function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  filter;
  long *local_e0;
  long local_d8;
  long local_d0;
  long lStack_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  object_tools *local_78;
  _Any_data local_70;
  code *local_60;
  code *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  cl_parser::get_string(cl,"-skl",&local_a0);
  create_filter((function<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                 *)&local_70,&local_a0);
  ppxVar9 = (object->m_motions).
            super__Vector_base<xray_re::xr_skl_motion_*,_std::allocator<xray_re::xr_skl_motion_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppxVar1 = (object->m_motions).
            super__Vector_base<xray_re::xr_skl_motion_*,_std::allocator<xray_re::xr_skl_motion_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppxVar9 != ppxVar1) {
    local_80 = &(this->super_batch_helper).m_output_folder;
    bVar5 = false;
    local_78 = this;
    do {
      if (local_60 == (code *)0x0) {
        uVar7 = std::__throw_bad_function_call();
        __clang_call_terminate(uVar7);
      }
      this_00 = *ppxVar9;
      bVar4 = (*local_58)(&local_70,&(this_00->super_xr_motion).m_name);
      if (bVar4) {
        pcVar2 = (this_00->super_xr_motion).m_name._M_dataplus._M_p;
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c0,pcVar2,
                   pcVar2 + (this_00->super_xr_motion).m_name._M_string_length);
        sVar3 = (local_78->super_batch_helper).m_output_file._M_string_length;
        if (sVar3 == 0) {
          std::operator+(&local_50,local_80,&local_c0);
          plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
          local_e0 = &local_d0;
          plVar8 = plVar6 + 2;
          if ((long *)*plVar6 == plVar8) {
            local_d0 = *plVar8;
            lStack_c8 = plVar6[3];
          }
          else {
            local_d0 = *plVar8;
            local_e0 = (long *)*plVar6;
          }
          local_d8 = plVar6[1];
          *plVar6 = (long)plVar8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
        }
        else {
          local_e0 = &local_d0;
          pcVar2 = (local_78->super_batch_helper).m_output_file._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>((string *)&local_e0,pcVar2,pcVar2 + sVar3);
        }
        if ((sVar3 == 0) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2)) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        bVar5 = xray_re::xr_skl_motion::save_skl(this_00,(char *)local_e0);
        if (!bVar5) {
          xray_re::msg("can\'t save %s",local_e0);
        }
        if (local_e0 != &local_d0) {
          operator_delete(local_e0,local_d0 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        bVar5 = true;
      }
      ppxVar9 = ppxVar9 + 1;
    } while (ppxVar9 != ppxVar1);
    if (bVar5) goto LAB_0013e0f8;
  }
  xray_re::msg("can\'t find motion %s",local_a0._M_dataplus._M_p);
LAB_0013e0f8:
  if (local_60 != (code *)0x0) {
    (*local_60)(&local_70,&local_70,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,
                    CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                             local_a0.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void object_tools::save_skl(xray_re::xr_object& object, const char* source, const cl_parser& cl) const
{
	std::string motion_name;
	cl.get_string("-skl", motion_name);

	auto filter = create_filter(motion_name);

	bool found = false;
	for (auto el : object.motions()) {
		if (!filter(el->name()))
			continue;

		std::string name{ el->name() };
		std::string target = m_output_file.empty() ? m_output_folder + name + ".skl" : m_output_file;
		if (!el->save_skl(target.c_str()))
			msg("can't save %s", target.c_str());

		found = true;
	}
	if (!found)
		msg("can't find motion %s", motion_name.c_str());
}